

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearraymatcher.cpp
# Opt level: O2

qsizetype __thiscall
QByteArrayMatcher::indexIn(QByteArrayMatcher *this,QByteArrayView data,qsizetype from)

{
  qsizetype qVar1;
  
  qVar1 = 0;
  if (0 < from) {
    qVar1 = from;
  }
  qVar1 = bm_find((uchar *)data.m_data,data.m_size,qVar1,(this->field_2).p.p,(this->field_2).p.l,
                  (uchar *)(this->field_2).dummy);
  return qVar1;
}

Assistant:

qsizetype QByteArrayMatcher::indexIn(QByteArrayView data, qsizetype from) const
{
    if (from < 0)
        from = 0;
    return bm_find(reinterpret_cast<const uchar *>(data.data()), data.size(), from,
                   p.p, p.l, p.q_skiptable);
}